

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Path.h
# Opt level: O0

bool __thiscall JetHead::Path::append(Path *this,char *path)

{
  byte bVar1;
  allocator<char> local_39;
  string local_38 [32];
  char *local_18;
  char *path_local;
  Path *this_local;
  
  local_18 = path;
  path_local = (char *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_38,path,&local_39);
  bVar1 = JetHead::Path::append((string *)this);
  std::__cxx11::string::~string(local_38);
  std::allocator<char>::~allocator(&local_39);
  return (bool)(bVar1 & 1);
}

Assistant:

bool append( const char *path ) { return append( JHSTD::string( path ) ); }